

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding_validators.h
# Opt level: O1

bool cppcms::encoding::windows_1257_valid<char_const*>(char *p,char *e,size_t *count)

{
  byte bVar1;
  size_t sVar2;
  bool bVar3;
  
  bVar3 = p == e;
  if (!bVar3) {
    sVar2 = *count;
    do {
      sVar2 = sVar2 + 1;
      *count = sVar2;
      bVar1 = *p;
      if ((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) {
        if (bVar1 < 0x20) {
          return bVar3;
        }
        if (bVar1 == 0x7f) {
          return bVar3;
        }
        if ((bVar1 - 0x81 < 0x25) && ((0x114a808a85U >> ((ulong)(bVar1 - 0x81) & 0x3f) & 1) != 0)) {
          return bVar3;
        }
      }
      p = (char *)((byte *)p + 1);
      bVar3 = p == e;
    } while (!bVar3);
  }
  return bVar3;
}

Assistant:

bool windows_1257_valid(Iterator p,Iterator e,size_t &count)
	{
		while(p!=e) {
			count++;
			unsigned c=(unsigned char)*p++;
			if(c==0x09 || c==0xA || c==0xD)
				continue;
			if(c<0x20 || 0x7F==c)
				return false;
			switch(c) {
			case 0x81:
			case 0x83:
			case 0x88:
			case 0x8A:
			case 0x8C:
			case 0x90:
			case 0x98:
			case 0x9A:
			case 0x9C:
			case 0x9F:
			case 0xA1:
			case 0xA5:
				return false;
			}
		}
		return true;
	}